

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,string *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  string *file2;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CMAKE_DISABLE_SOURCE_CHANGES","");
  bVar2 = IsOn(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  if (bVar2) {
    psVar4 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    file2 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    bVar2 = cmsys::SystemTools::SameFile(psVar4,file2);
    if (bVar2) {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_DISABLE_IN_SOURCE_BUILD","");
      bVar3 = IsOn(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar3 = !bVar3;
    }
    else {
      psVar4 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
      bVar2 = cmsys::SystemTools::IsSubDirectory(fileName,psVar4);
      if (bVar2) {
        psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
        bVar2 = cmsys::SystemTools::IsSubDirectory(fileName,psVar4);
        if (!bVar2) {
          psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
          bVar3 = cmsys::SystemTools::SameFile(fileName,psVar4);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmMakefile::CanIWriteThisFile(std::string const& fileName) const
{
  if (!this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES")) {
    return true;
  }
  // If we are doing an in-source build, then the test will always fail
  if (cmSystemTools::SameFile(this->GetHomeDirectory(),
                              this->GetHomeOutputDirectory())) {
    return !this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD");
  }

  return !cmSystemTools::IsSubDirectory(fileName, this->GetHomeDirectory()) ||
    cmSystemTools::IsSubDirectory(fileName, this->GetHomeOutputDirectory()) ||
    cmSystemTools::SameFile(fileName, this->GetHomeOutputDirectory());
}